

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void transaction_in_memory_snapshot_test(void)

{
  void *pvVar1;
  fdb_status fVar2;
  int iVar3;
  fdb_status fVar4;
  fdb_kvs_handle **keylen;
  size_t sVar5;
  size_t valuelen;
  ulong uVar6;
  uint uVar7;
  ulong unaff_RBP;
  fdb_kvs_handle *pfVar8;
  char *unaff_R12;
  fdb_doc *pfVar9;
  fdb_kvs_config *config;
  char *pcVar10;
  pthread_mutex_t *__mutex;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_txn1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db_txn1;
  void *thread_ret;
  pthread_t tid;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  fdb_doc *pfStack_440;
  fdb_iterator *pfStack_438;
  fdb_kvs_handle *pfStack_430;
  fdb_iterator *pfStack_428;
  fdb_kvs_handle *pfStack_420;
  ulong uStack_418;
  ulong uStack_410;
  fdb_file_handle *pfStack_408;
  char acStack_400 [16];
  pthread_mutex_t *ppStack_3f0;
  fdb_kvs_handle *pfStack_3e8;
  fdb_kvs_config fStack_3e0;
  timeval tStack_3c8;
  undefined1 *puStack_3b8;
  char *pcStack_3b0;
  fdb_kvs_config *pfStack_3a0;
  fdb_file_handle **ppfStack_398;
  code *pcStack_390;
  fdb_kvs_handle *local_388;
  fdb_file_handle *local_380;
  fdb_file_handle *local_378;
  fdb_kvs_handle *local_370;
  void *local_368;
  pthread_t local_360;
  fdb_kvs_config local_358;
  timeval local_340;
  fdb_config local_330;
  char local_238 [256];
  fdb_kvs_config local_138 [11];
  
  keylen = &local_388;
  pcStack_390 = (code *)0x1189a1;
  gettimeofday(&local_340,(__timezone_ptr_t)0x0);
  pcStack_390 = (code *)0x1189a6;
  memleak_start();
  pcStack_390 = (code *)0x1189b2;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_390 = (code *)0x1189bf;
  fdb_get_default_config();
  config = &local_358;
  pcStack_390 = (code *)0x1189cc;
  fdb_get_default_kvs_config();
  local_330.buffercache_size = 0;
  local_330.wal_threshold = 0x400;
  local_330.flags = 1;
  local_330.purging_interval = 0;
  local_330.compaction_threshold = '\0';
  pcVar10 = (char *)&local_378;
  pcStack_390 = (code *)0x118a05;
  fdb_open((fdb_file_handle **)pcVar10,"./mvcc_test1",&local_330);
  pcStack_390 = (code *)0x118a16;
  fdb_kvs_open_default(local_378,&local_388,config);
  pcStack_390 = (code *)0x118a2c;
  pfVar8 = local_388;
  fVar2 = fdb_set_log_callback(local_388,logCallbackFunc,"transaction_in_memory_snapshot_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    config = local_138;
    pcVar10 = "body%d";
    unaff_R12 = local_238;
    unaff_RBP = 0;
    while( true ) {
      pcStack_390 = (code *)0x118a60;
      sprintf(&config->create_if_missing,"key%d",unaff_RBP);
      pcStack_390 = (code *)0x118a6f;
      sprintf(unaff_R12,"body%d",unaff_RBP);
      pfVar8 = local_388;
      pcStack_390 = (code *)0x118a7b;
      keylen = (fdb_kvs_handle **)strlen(&config->create_if_missing);
      pcStack_390 = (code *)0x118a86;
      sVar5 = strlen(unaff_R12);
      pcStack_390 = (code *)0x118a9a;
      fVar2 = fdb_set_kv(pfVar8,config,(size_t)keylen,unaff_R12,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      uVar7 = (int)unaff_RBP + 1;
      unaff_RBP = (ulong)uVar7;
      if (uVar7 == 10) {
        pcStack_390 = (code *)0x118ab5;
        fdb_commit(local_378,'\0');
        pcStack_390 = (code *)0x118ace;
        fdb_open(&local_380,"./mvcc_test1",&local_330);
        pcStack_390 = (code *)0x118ae0;
        fdb_kvs_open_default(local_380,&local_370,&local_358);
        pcStack_390 = (code *)0x118aed;
        fdb_begin_transaction(local_380,'\x02');
        uVar6 = 10;
        do {
          pcStack_390 = (code *)0x118b1c;
          sprintf(&local_138[0].create_if_missing,"key%d",uVar6);
          pcStack_390 = (code *)0x118b2b;
          sprintf(local_238,"body%d_txn1",uVar6);
          pfVar8 = local_370;
          pcStack_390 = (code *)0x118b38;
          sVar5 = strlen(&local_138[0].create_if_missing);
          pcStack_390 = (code *)0x118b43;
          valuelen = strlen(local_238);
          pcStack_390 = (code *)0x118b57;
          fdb_set_kv(pfVar8,local_138,sVar5,local_238,valuelen);
          uVar7 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar7;
        } while (uVar7 != 10000);
        pcStack_390 = (code *)0x118b7b;
        pthread_create(&local_360,(pthread_attr_t *)0x0,in_memory_snapshot_thread,local_388);
        pcStack_390 = (code *)0x118b87;
        fdb_end_transaction(local_380,'\0');
        pcStack_390 = (code *)0x118b94;
        pthread_join(local_360,&local_368);
        pcStack_390 = (code *)0x118b9e;
        fdb_close(local_378);
        pcStack_390 = (code *)0x118ba8;
        fdb_close(local_380);
        pcStack_390 = (code *)0x118bad;
        fdb_shutdown();
        pcStack_390 = (code *)0x118bb2;
        memleak_end();
        pcVar10 = "%s PASSED\n";
        if (transaction_in_memory_snapshot_test()::__test_pass != '\0') {
          pcVar10 = "%s FAILED\n";
        }
        pcStack_390 = (code *)0x118be3;
        fprintf(_stderr,pcVar10,"transaction and in-memory snapshot interleaving test");
        return;
      }
    }
    pcStack_390 = (code *)0x118bfa;
    transaction_in_memory_snapshot_test();
  }
  pcStack_390 = parallel_iterator_thread;
  transaction_in_memory_snapshot_test();
  puStack_3b8 = (undefined1 *)keylen;
  pcStack_3b0 = unaff_R12;
  pfStack_3a0 = config;
  ppfStack_398 = (fdb_file_handle **)pcVar10;
  pcStack_390 = (code *)unaff_RBP;
  gettimeofday(&tStack_3c8,(__timezone_ptr_t)0x0);
  fdb_get_default_kvs_config();
  __mutex = (pthread_mutex_t *)&pfVar8->kvs;
  uStack_418 = 0;
  ppStack_3f0 = __mutex;
  pfStack_3e8 = pfVar8;
  while( true ) {
    if (*(int *)&(pfVar8->kvs_config).custom_cmp <= (int)uStack_418) {
      pthread_exit((void *)0x0);
    }
    fVar2 = fdb_open(&pfStack_408,(char *)(pfVar8->kvs_config).custom_cmp_param,
                     *(fdb_config **)&pfVar8->kvs_config);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe3d);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xe3d,"void *parallel_iterator_thread(void *)");
    }
    fVar2 = fdb_kvs_open_default(pfStack_408,&pfStack_420,&fStack_3e0);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe3f);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xe3f,"void *parallel_iterator_thread(void *)");
    }
    iVar3 = pthread_mutex_lock(__mutex);
    if (iVar3 != 0) break;
    fVar2 = fdb_snapshot_open(pfStack_420,&pfStack_430,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119021;
    pthread_mutex_unlock(__mutex);
    fdb_get_kvs_seqnum(pfStack_430,&uStack_410);
    fVar2 = fdb_iterator_init(pfStack_430,&pfStack_428,(void *)0x0,0,(void *)0x0,0,0);
    fdb_iterator_sequence_init(pfStack_430,&pfStack_438,0,0,0);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) {
      uVar6 = 0;
      while (fVar2 == FDB_RESULT_SUCCESS) {
        pfStack_440 = (fdb_doc *)0x0;
        fVar2 = fdb_iterator_get(pfStack_428,&pfStack_440);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_400,"key%05d",uVar6 & 0xffffffff);
        pfVar9 = pfStack_440;
        pvVar1 = pfStack_440->key;
        iVar3 = bcmp(pvVar1,acStack_400,pfStack_440->keylen);
        if (iVar3 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_400,pvVar1,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xe57);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe57,"void *parallel_iterator_thread(void *)");
        }
        uVar6 = uVar6 + 1;
        if ((uVar6 != pfVar9->seqnum) &&
           (fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                   ), pfVar9 = pfStack_440, uVar6 != pfStack_440->seqnum)) {
          __assert_fail("doc->seqnum == (fdb_seqnum_t)i+1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe58,"void *parallel_iterator_thread(void *)");
        }
        fdb_doc_free(pfVar9);
        pfStack_440 = (fdb_doc *)0x0;
        fVar2 = fdb_iterator_get(pfStack_438,&pfStack_440);
        pfVar9 = pfStack_440;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xe5e);
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe5e,"void *parallel_iterator_thread(void *)");
        }
        pvVar1 = pfStack_440->key;
        iVar3 = bcmp(pvVar1,acStack_400,pfStack_440->keylen);
        if (iVar3 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_400,pvVar1,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xe5f);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe5f,"void *parallel_iterator_thread(void *)");
        }
        if ((uVar6 != pfVar9->seqnum) &&
           (fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                   ), pfVar9 = pfStack_440, uVar6 != pfStack_440->seqnum)) {
          __assert_fail("doc->seqnum == (fdb_seqnum_t)i+1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xe60,"void *parallel_iterator_thread(void *)");
        }
        fdb_doc_free(pfVar9);
        fVar2 = fdb_iterator_next(pfStack_428);
        fVar4 = fdb_iterator_next(pfStack_438);
        pfVar8 = pfStack_3e8;
        __mutex = ppStack_3f0;
        if (fVar2 != fVar4) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                 );
          fVar4 = fdb_iterator_next(pfStack_438);
          pfVar8 = pfStack_3e8;
          __mutex = ppStack_3f0;
          if (fVar2 != fVar4) {
            __assert_fail("status == fdb_iterator_next(fit2)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xe65,"void *parallel_iterator_thread(void *)");
          }
        }
      }
      uStack_418 = uVar6;
      if ((uStack_410 != (uVar6 & 0xffffffff)) &&
         (fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                 ), uStack_410 != (uVar6 & 0xffffffff))) {
        __assert_fail("(fdb_seqnum_t)i == snap_seqnum",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe67,"void *parallel_iterator_thread(void *)");
      }
      fVar2 = fdb_iterator_close(pfStack_428);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe6b);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe6b,"void *parallel_iterator_thread(void *)");
      }
      fVar2 = fdb_iterator_close(pfStack_438);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe6d);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe6d,"void *parallel_iterator_thread(void *)");
      }
      fVar2 = fdb_kvs_close(pfStack_430);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe6f);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe6f,"void *parallel_iterator_thread(void *)");
      }
      fVar2 = fdb_kvs_close(pfStack_420);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe71);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe71,"void *parallel_iterator_thread(void *)");
      }
      fVar2 = fdb_close(pfStack_408);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe73);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe73,"void *parallel_iterator_thread(void *)");
      }
    }
  }
  std::__throw_system_error(iVar3);
LAB_00119021:
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0xe44);
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe44,"void *parallel_iterator_thread(void *)");
}

Assistant:

void transaction_in_memory_snapshot_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile, *dbfile_txn1;
    fdb_kvs_handle *db, *db_txn1;
    fdb_status status;

    char keybuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_in_memory_snapshot_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert the first set of key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf,
                            strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // open db and begin a transaction
    fdb_open(&dbfile_txn1, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);

    // concurrently update docs
    for (i=10;i<10000;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        fdb_set_kv(db_txn1, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
    }

    // Create in-memory snapshot thread
    thread_t tid;
    void *thread_ret;
    thread_create(&tid, in_memory_snapshot_thread, (void *)db);

    // commit txn1
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);

    thread_join(tid, &thread_ret);

    // close db file
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("transaction and in-memory snapshot interleaving test");
}